

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

void resobj_clear(CUPDLPresobj *resobj)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    if (*(long *)((long)in_RDI + 0x40) != 0) {
      free(*(void **)((long)in_RDI + 0x40));
      *(undefined8 *)((long)in_RDI + 0x40) = 0;
    }
    if (*(long *)((long)in_RDI + 0x48) != 0) {
      free(*(void **)((long)in_RDI + 0x48));
      *(undefined8 *)((long)in_RDI + 0x48) = 0;
    }
    if (*(long *)((long)in_RDI + 0x140) != 0) {
      free(*(void **)((long)in_RDI + 0x140));
      *(undefined8 *)((long)in_RDI + 0x140) = 0;
    }
    if (*(long *)((long)in_RDI + 0x148) != 0) {
      free(*(void **)((long)in_RDI + 0x148));
      *(undefined8 *)((long)in_RDI + 0x148) = 0;
    }
    if (*(long *)((long)in_RDI + 0x50) != 0) {
      free(*(void **)((long)in_RDI + 0x50));
      *(undefined8 *)((long)in_RDI + 0x50) = 0;
    }
    if (*(long *)((long)in_RDI + 0x58) != 0) {
      free(*(void **)((long)in_RDI + 0x58));
      *(undefined8 *)((long)in_RDI + 0x58) = 0;
    }
    if (*(long *)((long)in_RDI + 0x60) != 0) {
      free(*(void **)((long)in_RDI + 0x60));
      *(undefined8 *)((long)in_RDI + 0x60) = 0;
    }
    if (*(long *)((long)in_RDI + 0x68) != 0) {
      free(*(void **)((long)in_RDI + 0x68));
      *(undefined8 *)((long)in_RDI + 0x68) = 0;
    }
    if (*(long *)((long)in_RDI + 0x70) != 0) {
      free(*(void **)((long)in_RDI + 0x70));
      *(undefined8 *)((long)in_RDI + 0x70) = 0;
    }
    if (*(long *)((long)in_RDI + 0x78) != 0) {
      free(*(void **)((long)in_RDI + 0x78));
      *(undefined8 *)((long)in_RDI + 0x78) = 0;
    }
    if (*(long *)((long)in_RDI + 0xd0) != 0) {
      free(*(void **)((long)in_RDI + 0xd0));
      *(undefined8 *)((long)in_RDI + 0xd0) = 0;
    }
    if (*(long *)((long)in_RDI + 0xd8) != 0) {
      free(*(void **)((long)in_RDI + 0xd8));
      *(undefined8 *)((long)in_RDI + 0xd8) = 0;
    }
    if (*(long *)((long)in_RDI + 0xe0) != 0) {
      free(*(void **)((long)in_RDI + 0xe0));
      *(undefined8 *)((long)in_RDI + 0xe0) = 0;
    }
    if (*(long *)((long)in_RDI + 0xe8) != 0) {
      free(*(void **)((long)in_RDI + 0xe8));
      *(undefined8 *)((long)in_RDI + 0xe8) = 0;
    }
    if (*(long *)((long)in_RDI + 0xf0) != 0) {
      free(*(void **)((long)in_RDI + 0xf0));
      *(undefined8 *)((long)in_RDI + 0xf0) = 0;
    }
    if (*(long *)((long)in_RDI + 0xf8) != 0) {
      free(*(void **)((long)in_RDI + 0xf8));
      *(undefined8 *)((long)in_RDI + 0xf8) = 0;
    }
    if (*(long *)((long)in_RDI + 0x100) != 0) {
      free(*(void **)((long)in_RDI + 0x100));
      *(undefined8 *)((long)in_RDI + 0x100) = 0;
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void resobj_clear(CUPDLPresobj *resobj) {
  if (resobj) {
    if (resobj->primalResidual) {
      CUPDLP_FREE_VEC(resobj->primalResidual);
    }
    if (resobj->dualResidual) {
      CUPDLP_FREE_VEC(resobj->dualResidual);
    }
    if (resobj->primalResidualAverage) {
      CUPDLP_FREE_VEC(resobj->primalResidualAverage);
    }
    if (resobj->dualResidualAverage) {
      CUPDLP_FREE_VEC(resobj->dualResidualAverage);
    }
    if (resobj->dSlackPos) {
      CUPDLP_FREE_VEC(resobj->dSlackPos);
    }
    if (resobj->dSlackNeg) {
      CUPDLP_FREE_VEC(resobj->dSlackNeg);
    }
    if (resobj->dSlackPosAverage) {
      CUPDLP_FREE_VEC(resobj->dSlackPosAverage);
    }
    if (resobj->dSlackNegAverage) {
      CUPDLP_FREE_VEC(resobj->dSlackNegAverage);
    }
    if (resobj->dLowerFiltered) {
      CUPDLP_FREE_VEC(resobj->dLowerFiltered);
    }
    if (resobj->dUpperFiltered) {
      CUPDLP_FREE_VEC(resobj->dUpperFiltered);
    }
    if (resobj->primalInfeasRay) {
      CUPDLP_FREE_VEC(resobj->primalInfeasRay);
    }
    if (resobj->primalInfeasConstr) {
      CUPDLP_FREE_VEC(resobj->primalInfeasConstr);
    }
    if (resobj->primalInfeasBound) {
      CUPDLP_FREE_VEC(resobj->primalInfeasBound);
    }
    if (resobj->dualInfeasRay) {
      CUPDLP_FREE_VEC(resobj->dualInfeasRay);
    }
    if (resobj->dualInfeasLbRay) {
      CUPDLP_FREE_VEC(resobj->dualInfeasLbRay);
    }
    if (resobj->dualInfeasUbRay) {
      CUPDLP_FREE_VEC(resobj->dualInfeasUbRay);
    }
    if (resobj->dualInfeasConstr) {
      CUPDLP_FREE_VEC(resobj->dualInfeasConstr);
    }
    // if (resobj->dualInfeasBound) {
    //   CUPDLP_FREE_VEC(resobj->dualInfeasBound);
    // }
    cupdlp_free(resobj);
  }
}